

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocumentlayout.cpp
# Opt level: O2

bool isEmptyBlockAfterTable(QTextBlock *block,QTextFrame *previousFrame)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  QTextTable *pQVar4;
  
  pQVar4 = QtPrivate::qobject_cast_helper<QTextTable_const*,QObject_const>((QObject *)previousFrame)
  ;
  if (((pQVar4 != (QTextTable *)0x0) && (bVar1 = QTextBlock::isValid(block), bVar1)) &&
     (iVar2 = QTextBlock::length(block), iVar2 == 1)) {
    iVar2 = QTextFrame::lastPosition(previousFrame);
    iVar3 = QTextBlock::position(block);
    return iVar2 == iVar3 + -1;
  }
  return false;
}

Assistant:

static inline bool isEmptyBlockAfterTable(const QTextBlock &block, const QTextFrame *previousFrame)
{
    return qobject_cast<const QTextTable *>(previousFrame)
           && block.isValid()
           && block.length() == 1
           && previousFrame->lastPosition() == block.position() - 1
           ;
}